

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

int __thiscall S2Loop::CompareBoundary(S2Loop *this,S2Loop *b)

{
  bool bVar1;
  ostream *poVar2;
  S2Point *p;
  byte local_a1;
  byte local_7d;
  undefined1 local_78 [8];
  CompareBoundaryRelation relation;
  S2LogMessage local_60;
  S2LogMessageVoidify local_4d [20];
  byte local_39;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  S2Loop *local_20;
  S2Loop *b_local;
  S2Loop *this_local;
  
  local_20 = b;
  b_local = this;
  bVar1 = is_empty(this);
  local_39 = 0;
  local_7d = 0;
  if (!bVar1) {
    bVar1 = is_empty(local_20);
    local_7d = bVar1 ^ 0xff;
  }
  if (((local_7d ^ 0xff) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
               ,0x4a7,kFatal,(ostream *)&std::cerr);
    local_39 = 1;
    poVar2 = S2LogMessage::stream(&local_38);
    poVar2 = std::operator<<(poVar2,"Check failed: !is_empty() && !b->is_empty() ");
    S2LogMessageVoidify::operator&(&local_21,poVar2);
  }
  if ((local_39 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
  }
  bVar1 = is_full(local_20);
  relation._15_1_ = 0;
  local_a1 = 1;
  if (bVar1) {
    bVar1 = is_hole(local_20);
    local_a1 = bVar1 ^ 0xff;
  }
  if (((local_a1 ^ 0xff) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
               ,0x4a8,kFatal,(ostream *)&std::cerr);
    relation._15_1_ = 1;
    poVar2 = S2LogMessage::stream(&local_60);
    poVar2 = std::operator<<(poVar2,"Check failed: !b->is_full() || !b->is_hole() ");
    S2LogMessageVoidify::operator&(local_4d,poVar2);
  }
  if ((relation._15_1_ & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_60);
  }
  bVar1 = S2LatLngRect::Intersects(&this->bound_,&local_20->bound_);
  if (bVar1) {
    bVar1 = is_full(this);
    if (bVar1) {
      this_local._4_4_ = 1;
    }
    else {
      bVar1 = is_full(local_20);
      if (bVar1) {
        this_local._4_4_ = -1;
      }
      else {
        bVar1 = is_hole(local_20);
        CompareBoundaryRelation::CompareBoundaryRelation((CompareBoundaryRelation *)local_78,bVar1);
        bVar1 = HasCrossingRelation(this,local_20,(LoopRelation *)local_78);
        if (bVar1) {
          this_local._4_4_ = 0;
        }
        else {
          bVar1 = CompareBoundaryRelation::found_shared_vertex((CompareBoundaryRelation *)local_78);
          if (bVar1) {
            bVar1 = CompareBoundaryRelation::contains_edge((CompareBoundaryRelation *)local_78);
            this_local._4_4_ = -1;
            if (bVar1) {
              this_local._4_4_ = 1;
            }
          }
          else {
            p = vertex(local_20,0);
            bVar1 = Contains(this,p);
            this_local._4_4_ = -1;
            if (bVar1) {
              this_local._4_4_ = 1;
            }
          }
        }
        CompareBoundaryRelation::~CompareBoundaryRelation((CompareBoundaryRelation *)local_78);
      }
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int S2Loop::CompareBoundary(const S2Loop* b) const {
  S2_DCHECK(!is_empty() && !b->is_empty());
  S2_DCHECK(!b->is_full() || !b->is_hole());

  // The bounds must intersect for containment or crossing.
  if (!bound_.Intersects(b->bound_)) return -1;

  // Full loops are handled as though the loop surrounded the entire sphere.
  if (is_full()) return 1;
  if (b->is_full()) return -1;

  // Check whether there are any edge crossings, and also check the loop
  // relationship at any shared vertices.
  CompareBoundaryRelation relation(b->is_hole());
  if (HasCrossingRelation(*this, *b, &relation)) return 0;
  if (relation.found_shared_vertex()) {
    return relation.contains_edge() ? 1 : -1;
  }

  // There are no edge intersections or shared vertices, so we can check
  // whether A contains an arbitrary vertex of B.
  return Contains(b->vertex(0)) ? 1 : -1;
}